

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tquant_api.h
# Opt level: O1

void __thiscall
tquant::api::CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_>::CallResult
          (CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *this,string *a_msg)

{
  pointer pcVar1;
  
  (this->value).
  super___shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->value).
  super___shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar1 = (a_msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar1,pcVar1 + a_msg->_M_string_length);
  return;
}

Assistant:

CallResult(const string& a_msg)
				: msg(a_msg)
			{
			}